

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

roaring64_bitmap_t * roaring64_bitmap_copy(roaring64_bitmap_t *r)

{
  roaring64_bitmap_t *prVar1;
  art_val_t *val;
  leaf_t *result_leaf;
  container_t *result_container;
  uint8_t result_typecode;
  leaf_t *leaf;
  art_iterator_t it;
  roaring64_bitmap_t *result;
  leaf_t *in_stack_ffffffffffffff48;
  uint8_t typecode;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 copy_on_write;
  art_t *in_stack_ffffffffffffff60;
  art_t *art;
  container_t *in_stack_ffffffffffffff68;
  art_t *local_90;
  
  prVar1 = roaring64_bitmap_create();
  art_init_iterator(in_stack_ffffffffffffff60,(_Bool)in_stack_ffffffffffffff5f);
  while (typecode = (uint8_t)((ulong)in_stack_ffffffffffffff48 >> 0x38), local_90 != (art_t *)0x0) {
    copy_on_write = *(undefined1 *)((long)&local_90->root + 6);
    art = local_90;
    val = (art_val_t *)
          get_copy_of_container(in_stack_ffffffffffffff68,(uint8_t *)local_90,(_Bool)copy_on_write);
    in_stack_ffffffffffffff48 = create_leaf(val,typecode);
    art_insert(art,(art_key_chunk_t *)CONCAT17(copy_on_write,in_stack_ffffffffffffff58),val);
    art_iterator_next((art_iterator_t *)0x10be9e);
  }
  return prVar1;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_copy(const roaring64_bitmap_t *r) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        uint8_t result_typecode = leaf->typecode;
        container_t *result_container = get_copy_of_container(
            leaf->container, &result_typecode, /*copy_on_write=*/false);
        leaf_t *result_leaf = create_leaf(result_container, result_typecode);
        art_insert(&result->art, it.key, (art_val_t *)result_leaf);
        art_iterator_next(&it);
    }
    return result;
}